

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_add.c
# Opt level: O0

word zzSub(word *c,word *a,word *b,size_t n)

{
  ulong uVar1;
  size_t i;
  word w;
  word borrow;
  size_t n_local;
  word *b_local;
  word *a_local;
  word *c_local;
  
  borrow = 0;
  for (i = 0; i < n; i = i + 1) {
    uVar1 = b[i] + borrow;
    borrow = (word)(int)(uint)(a[i] < uVar1 || uVar1 < borrow);
    c[i] = a[i] - uVar1;
  }
  return borrow;
}

Assistant:

word zzSub(word c[], const word a[], const word b[], size_t n)
{
	register word borrow = 0;
	register word w;
	size_t i;
	ASSERT(wwIsSameOrDisjoint(a, c, n));
	ASSERT(wwIsSameOrDisjoint(b, c, n));
	for (i = 0; i < n; ++i)
	{
#ifndef SAFE_FAST
		w = b[i] + borrow;
		borrow = wordLess01(w, borrow);
		borrow |= wordLess01(a[i], w);
		c[i] = a[i] - w;
#else
		w = a[i] - borrow;
		if (w > (word)~borrow)
			c[i] = ~b[i];
		else
			w -= b[i], borrow = w > (word)~b[i], c[i] = w;
#endif
	}
	w = 0;
	return borrow;
}